

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equation-solver.cpp
# Opt level: O2

int msdfgen::solveCubicNormed(double *x,double a,double b,double c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  dVar5 = a * a;
  auVar6._0_8_ = (dVar5 + dVar5 + b * -9.0) * a + c * 27.0;
  auVar6._8_8_ = b * -3.0 + dVar5;
  auVar6 = divpd(auVar6,_DAT_001993c0);
  dVar2 = auVar6._8_8_;
  dVar3 = auVar6._0_8_;
  dVar5 = dVar2 * dVar2 * dVar2;
  if (dVar5 <= dVar3 * dVar3) {
    dVar5 = dVar3 * dVar3 - dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar5 = pow(ABS(dVar3) + dVar5,0.3333333333333333);
    dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)-dVar5 | -(ulong)(dVar3 < 0.0) & (ulong)dVar5);
    dVar2 = (double)(~-(ulong)(-dVar5 == dVar5) & (ulong)(dVar2 / dVar3));
    dVar5 = dVar3 + dVar2;
    *x = dVar5 - a / 3.0;
    dVar2 = (dVar3 - dVar2) * 0.8660254037844386;
    x[1] = dVar5 * -0.5 - a / 3.0;
    x[2] = dVar2;
    if (1e-14 <= ABS(dVar2)) {
      iVar1 = 1;
    }
    else {
      iVar1 = 2;
    }
  }
  else {
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar4 = -1.0;
    if (-1.0 <= dVar3 / dVar5) {
      dVar4 = dVar3 / dVar5;
    }
    dVar5 = 1.0;
    if (dVar4 <= 1.0) {
      dVar5 = dVar4;
    }
    dVar5 = acos(dVar5);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar2 = dVar2 * -2.0;
    dVar3 = cos(dVar5 / 3.0);
    dVar4 = a / -3.0;
    *x = dVar3 * dVar2 + dVar4;
    dVar3 = cos((dVar5 + 6.283185307179586) / 3.0);
    x[1] = dVar3 * dVar2 + dVar4;
    dVar5 = cos((dVar5 + -6.283185307179586) / 3.0);
    x[2] = dVar5 * dVar2 + dVar4;
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int solveCubicNormed(double *x, double a, double b, double c) {
    double a2 = a*a;
    double q  = (a2 - 3*b)/9; 
    double r  = (a*(2*a2-9*b) + 27*c)/54;
    double r2 = r*r;
    double q3 = q*q*q;
    double A, B;
    if (r2 < q3) {
        double t = r/sqrt(q3);
        if (t < -1) t = -1;
        if (t > 1) t = 1;
        t = acos(t);
        a /= 3; q = -2*sqrt(q);
        x[0] = q*cos(t/3)-a;
        x[1] = q*cos((t+2*M_PI)/3)-a;
        x[2] = q*cos((t-2*M_PI)/3)-a;
        return 3;
    } else {
        A = -pow(fabs(r)+sqrt(r2-q3), 1/3.); 
        if (r < 0) A = -A;
        B = A == 0 ? 0 : q/A;
        a /= 3;
        x[0] = (A+B)-a;
        x[1] = -0.5*(A+B)-a;
        x[2] = 0.5*sqrt(3.)*(A-B);
        if (fabs(x[2]) < 1e-14)
            return 2;
        return 1;
    }
}